

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Symbol __thiscall
google::protobuf::DescriptorPool::NewPlaceholderWithMutexHeld
          (DescriptorPool *this,StringPiece name,PlaceholderType placeholder_type)

{
  byte bVar1;
  Tables *pTVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  size_type n;
  string *psVar7;
  FileDescriptor *pFVar8;
  SymbolBase *__s;
  string *psVar9;
  undefined8 *puVar10;
  AlphaNum *b;
  bool bVar11;
  StringPiece SVar12;
  StringPiece local_e8;
  StringPiece local_d8;
  StringPiece local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_80;
  AlphaNum local_60;
  
  local_d8.length_ = name.length_;
  local_d8.ptr_ = name.ptr_;
  local_e8 = (StringPiece)ZEXT816(0);
  local_c8 = (StringPiece)ZEXT816(0);
  bVar11 = (AlphaNum *)local_d8.length_ == (AlphaNum *)0x0;
  __s = (anonymous_namespace)::kNullSymbol;
  if (!bVar11) {
    b = (AlphaNum *)0x0;
    bVar5 = false;
    bVar6 = false;
    do {
      bVar1 = local_d8.ptr_[(long)b];
      bVar4 = true;
      if (((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) || (bVar1 == 0x5f || (byte)(bVar1 - 0x30) < 10)) {
        bVar6 = false;
        bVar5 = false;
      }
      else if (bVar1 == 0x2e) {
        bVar6 = bVar5;
        if (!bVar5) {
          bVar6 = true;
        }
        bVar4 = (bool)(bVar5 ^ 1);
        bVar5 = bVar6;
      }
      else {
        bVar4 = false;
      }
      if (!bVar4) break;
      b = (AlphaNum *)((long)&b->piece_data_ + 1);
      bVar11 = (AlphaNum *)local_d8.length_ == b;
    } while (!bVar11);
    if (!(bool)(~bVar11 | bVar6)) {
      SVar12 = name;
      if (*local_d8.ptr_ == '.') {
        SVar12 = stringpiece_internal::StringPiece::substr(&local_d8,1,0xffffffffffffffff);
      }
      local_e8 = SVar12;
      n = stringpiece_internal::StringPiece::rfind(&local_e8,'.',0xffffffffffffffff);
      if (n == 0xffffffffffffffff) {
        if ((internal::init_protobuf_defaults_state & 1) == 0) {
          internal::InitProtobufDefaultsSlow();
        }
        local_c8 = local_e8;
        psVar7 = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
      }
      else {
        pTVar2 = (this->tables_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                 _M_head_impl;
        local_b0._0_16_ = stringpiece_internal::StringPiece::substr(&local_e8,0,n);
        psVar7 = (string *)anon_unknown_1::TableArena::AllocRawInternal(&pTVar2->arena_,0x20,'\x01')
        ;
        stringpiece_internal::StringPiece::ToString_abi_cxx11_(psVar7,(StringPiece *)&local_b0);
        local_c8 = stringpiece_internal::StringPiece::substr(&local_e8,n + 1,0xffffffffffffffff);
      }
      local_b0._M_dataplus._M_p = local_e8.ptr_;
      local_b0._M_string_length = local_e8.length_;
      local_60.piece_data_ = ".placeholder.proto";
      local_60.piece_size_ = 0x12;
      StrCat_abi_cxx11_(&local_80,(protobuf *)&local_b0,&local_60,b);
      SVar12.length_ = local_80._M_string_length;
      SVar12.ptr_ = local_80._M_dataplus._M_p;
      if ((long)local_80._M_string_length < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (local_80._M_string_length,"string length exceeds max size");
      }
      pFVar8 = NewPlaceholderFileWithMutexHeld(this,SVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      *(string **)(pFVar8 + 8) = psVar7;
      if (placeholder_type == PLACEHOLDER_ENUM) {
        *(undefined4 *)(pFVar8 + 0x30) = 1;
        __s = (SymbolBase *)
              anon_unknown_1::TableArena::AllocRawInternal
                        (&((this->tables_)._M_t.
                           super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                           .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                          ._M_head_impl)->arena_,0x48,'\x19');
        *(SymbolBase **)(pFVar8 + 0x60) = __s;
        *(undefined8 *)__s = 0;
        *(undefined8 *)(__s + 8) = 0;
        *(undefined8 *)(__s + 0x10) = 0;
        *(undefined8 *)(__s + 0x18) = 0;
        *(undefined8 *)(__s + 0x20) = 0;
        *(undefined8 *)(__s + 0x28) = 0;
        *(undefined8 *)(__s + 0x30) = 0;
        *(undefined8 *)(__s + 0x38) = 0;
        *(undefined8 *)(__s + 0x40) = 0;
        psVar9 = Tables::
                 AllocateStringArray<google::protobuf::stringpiece_internal::StringPiece&,google::protobuf::stringpiece_internal::StringPiece&>
                           ((this->tables_)._M_t.
                            super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                            .
                            super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                            ._M_head_impl,&local_c8,&local_e8);
        *(string **)(__s + 8) = psVar9;
        *(FileDescriptor **)(__s + 0x10) = pFVar8;
        *(undefined1 **)(__s + 0x20) = _EnumOptions_default_instance_;
        bVar1 = __s[1].symbol_type_;
        __s[1].symbol_type_ = bVar1 | 1;
        if ((AlphaNum *)local_d8.length_ == (AlphaNum *)0x0) {
LAB_00357a07:
          __assert_fail("i < length_",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.h"
                        ,0xf3,
                        "char google::protobuf::stringpiece_internal::StringPiece::operator[](size_type) const"
                       );
        }
        __s[1].symbol_type_ = bVar1 & 0xfd | 1 | (*local_d8.ptr_ != '.') * '\x02';
        *(undefined4 *)(__s + 4) = 1;
        puVar10 = (undefined8 *)
                  anon_unknown_1::TableArena::AllocRawInternal
                            (&((this->tables_)._M_t.
                               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                               .
                               super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                              ._M_head_impl)->arena_,0x20,'\x14');
        *(undefined8 **)(__s + 0x28) = puVar10;
        *(undefined2 *)(__s + 2) = 0xffff;
        puVar10[2] = 0;
        puVar10[3] = 0;
        *puVar10 = 0;
        puVar10[1] = 0;
        pTVar2 = (this->tables_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                 _M_head_impl;
        if (psVar7->_M_string_length == 0) {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"PLACEHOLDER_VALUE","");
        }
        else {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          pcVar3 = (psVar7->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar3,pcVar3 + psVar7->_M_string_length);
          std::__cxx11::string::append((char *)&local_b0);
        }
        psVar7 = Tables::AllocateStringArray<char_const(&)[18],std::__cxx11::string>
                           (pTVar2,(char (*) [18])0x43ff02,&local_b0);
        puVar10[1] = psVar7;
        if ((StringPiece *)local_b0._M_dataplus._M_p != (StringPiece *)&local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        *(undefined4 *)((long)puVar10 + 4) = 0;
        puVar10[2] = __s;
        puVar10[3] = _EnumValueOptions_default_instance_;
        __s->symbol_type_ = '\x04';
      }
      else {
        *(undefined4 *)(pFVar8 + 0x2c) = 1;
        __s = (SymbolBase *)
              anon_unknown_1::TableArena::AllocRawInternal
                        (&((this->tables_)._M_t.
                           super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                           .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                          ._M_head_impl)->arena_,0x88,'!');
        *(SymbolBase **)(pFVar8 + 0x58) = __s;
        memset(__s,0,0x88);
        psVar7 = Tables::
                 AllocateStringArray<google::protobuf::stringpiece_internal::StringPiece&,google::protobuf::stringpiece_internal::StringPiece&>
                           ((this->tables_)._M_t.
                            super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                            .
                            super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                            ._M_head_impl,&local_c8,&local_e8);
        *(string **)(__s + 8) = psVar7;
        *(FileDescriptor **)(__s + 0x10) = pFVar8;
        *(undefined1 **)(__s + 0x20) = _MessageOptions_default_instance_;
        bVar1 = __s[1].symbol_type_;
        __s[1].symbol_type_ = bVar1 | 1;
        if ((AlphaNum *)local_d8.length_ == (AlphaNum *)0x0) goto LAB_00357a07;
        __s[1].symbol_type_ = bVar1 & 0xfd | 1 | (*local_d8.ptr_ != '.') * '\x02';
        if (placeholder_type == PLACEHOLDER_EXTENDABLE_MESSAGE) {
          *(undefined4 *)(__s + 0x78) = 1;
          puVar10 = (undefined8 *)
                    anon_unknown_1::TableArena::AllocRawInternal
                              (&((this->tables_)._M_t.
                                 super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                                 .
                                 super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                                ._M_head_impl)->arena_,0x10,'\x12');
          *(undefined8 **)(__s + 0x48) = puVar10;
          *puVar10 = 0x2000000000000001;
          puVar10[1] = 0;
        }
        __s->symbol_type_ = '\x01';
      }
    }
  }
  return (Symbol)__s;
}

Assistant:

Symbol DescriptorPool::NewPlaceholderWithMutexHeld(
    StringPiece name, PlaceholderType placeholder_type) const {
  if (mutex_) {
    mutex_->AssertHeld();
  }
  // Compute names.
  StringPiece placeholder_full_name;
  StringPiece placeholder_name;
  const std::string* placeholder_package;

  if (!ValidateQualifiedName(name)) return kNullSymbol;
  if (name[0] == '.') {
    // Fully-qualified.
    placeholder_full_name = name.substr(1);
  } else {
    placeholder_full_name = name;
  }

  std::string::size_type dotpos = placeholder_full_name.find_last_of('.');
  if (dotpos != std::string::npos) {
    placeholder_package =
        tables_->AllocateString(placeholder_full_name.substr(0, dotpos));
    placeholder_name = placeholder_full_name.substr(dotpos + 1);
  } else {
    placeholder_package = &internal::GetEmptyString();
    placeholder_name = placeholder_full_name;
  }

  // Create the placeholders.
  FileDescriptor* placeholder_file = NewPlaceholderFileWithMutexHeld(
      StrCat(placeholder_full_name, ".placeholder.proto"));
  placeholder_file->package_ = placeholder_package;

  if (placeholder_type == PLACEHOLDER_ENUM) {
    placeholder_file->enum_type_count_ = 1;
    placeholder_file->enum_types_ = tables_->AllocateArray<EnumDescriptor>(1);

    EnumDescriptor* placeholder_enum = &placeholder_file->enum_types_[0];
    memset(static_cast<void*>(placeholder_enum), 0, sizeof(*placeholder_enum));

    placeholder_enum->all_names_ =
        tables_->AllocateStringArray(placeholder_name, placeholder_full_name);
    placeholder_enum->file_ = placeholder_file;
    placeholder_enum->options_ = &EnumOptions::default_instance();
    placeholder_enum->is_placeholder_ = true;
    placeholder_enum->is_unqualified_placeholder_ = (name[0] != '.');

    // Enums must have at least one value.
    placeholder_enum->value_count_ = 1;
    placeholder_enum->values_ = tables_->AllocateArray<EnumValueDescriptor>(1);
    // Disable fast-path lookup for this enum.
    placeholder_enum->sequential_value_limit_ = -1;

    EnumValueDescriptor* placeholder_value = &placeholder_enum->values_[0];
    memset(static_cast<void*>(placeholder_value), 0,
           sizeof(*placeholder_value));

    // Note that enum value names are siblings of their type, not children.
    placeholder_value->all_names_ = tables_->AllocateStringArray(
        "PLACEHOLDER_VALUE", placeholder_package->empty()
                                 ? "PLACEHOLDER_VALUE"
                                 : *placeholder_package + ".PLACEHOLDER_VALUE");

    placeholder_value->number_ = 0;
    placeholder_value->type_ = placeholder_enum;
    placeholder_value->options_ = &EnumValueOptions::default_instance();

    return Symbol(placeholder_enum);
  } else {
    placeholder_file->message_type_count_ = 1;
    placeholder_file->message_types_ = tables_->AllocateArray<Descriptor>(1);

    Descriptor* placeholder_message = &placeholder_file->message_types_[0];
    memset(static_cast<void*>(placeholder_message), 0,
           sizeof(*placeholder_message));

    placeholder_message->all_names_ =
        tables_->AllocateStringArray(placeholder_name, placeholder_full_name);
    placeholder_message->file_ = placeholder_file;
    placeholder_message->options_ = &MessageOptions::default_instance();
    placeholder_message->is_placeholder_ = true;
    placeholder_message->is_unqualified_placeholder_ = (name[0] != '.');

    if (placeholder_type == PLACEHOLDER_EXTENDABLE_MESSAGE) {
      placeholder_message->extension_range_count_ = 1;
      placeholder_message->extension_ranges_ =
          tables_->AllocateArray<Descriptor::ExtensionRange>(1);
      placeholder_message->extension_ranges_->start = 1;
      // kMaxNumber + 1 because ExtensionRange::end is exclusive.
      placeholder_message->extension_ranges_->end =
          FieldDescriptor::kMaxNumber + 1;
      placeholder_message->extension_ranges_->options_ = nullptr;
    }

    return Symbol(placeholder_message);
  }
}